

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

AssignmentStatement * __thiscall Parser::assignStmt(Parser *this,ExprNode *id)

{
  pointer pcVar1;
  _Alloc_hider this_00;
  ExprNode *pEVar2;
  AssignmentStatement *this_01;
  Testlist *testlist;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  Token openBrace;
  undefined1 local_200 [32];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  ExprNode *local_1c0;
  pointer ppSStack_1b8;
  undefined1 local_1b0 [32];
  ExprNode *local_190;
  _Alloc_hider local_188;
  string local_180;
  string local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined8 local_e0;
  pointer ppSStack_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Tokenizer::getToken((Token *)&local_120,this->tokenizer);
  if (local_e0._6_1_ == '=') {
    Tokenizer::getToken((Token *)local_200,this->tokenizer);
    std::__cxx11::string::operator=((string *)local_120._M_local_buf,(string *)local_200);
    std::__cxx11::string::operator=((string *)local_100._M_local_buf,(string *)&local_1e0);
    local_e0 = local_1c0;
    ppSStack_d8 = ppSStack_1b8;
    std::__cxx11::string::operator=((string *)local_d0,(string *)local_1b0);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if (local_e0._6_1_ == '[') {
      testlist = arrayInit(this);
      this_01 = (AssignmentStatement *)operator_new(0xf0);
      ExprNode::token((Token *)local_200,id);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_200._0_8_,(pointer)(local_200._0_8_ + local_200._8_8_));
      AssignmentStatement::AssignmentStatement(this_01,&local_160,testlist);
      local_130._0_8_ = local_160.field_2._0_8_;
      uVar3 = local_160._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
LAB_00107bb3:
        operator_delete((void *)uVar3,
                        (ulong)((long)&(((Statements *)local_130._M_allocated_capacity)->_statements
                                       ).
                                       super__Vector_base<Statement_*,_std::allocator<Statement_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
    else {
      Tokenizer::ungetToken(this->tokenizer);
      pEVar2 = exprOrTest(this);
      this_01 = (AssignmentStatement *)operator_new(0xf0);
      ExprNode::token((Token *)local_200,id);
      local_140._M_allocated_capacity = (size_type)&local_130;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,local_200._0_8_,(pointer)(local_200._0_8_ + local_200._8_8_));
      AssignmentStatement::AssignmentStatement(this_01,(string *)&local_140,pEVar2);
      uVar3 = local_140._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_allocated_capacity != &local_130) goto LAB_00107bb3;
    }
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) goto LAB_00107c00;
  }
  else {
    if (local_e0._6_1_ != '[') {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Parser::assignStmt","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Expected an equal sign, instead got","");
      die(this,&local_50,&local_70,(Token *)&local_120);
LAB_00107ce6:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Parser::assignStmt","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Expected an equal sign, instead got","");
      die(this,&local_90,&local_b0,(Token *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      Token::~Token((Token *)&local_120);
      _Unwind_Resume(extraout_RAX);
    }
    Tokenizer::ungetToken(this->tokenizer);
    local_190 = sub(this);
    local_188._M_p = (pointer)id;
    Tokenizer::getToken((Token *)local_200,this->tokenizer);
    std::__cxx11::string::operator=((string *)local_120._M_local_buf,(string *)local_200);
    std::__cxx11::string::operator=((string *)local_100._M_local_buf,(string *)&local_1e0);
    local_e0 = local_1c0;
    ppSStack_d8 = ppSStack_1b8;
    std::__cxx11::string::operator=((string *)local_d0,(string *)local_1b0);
    pcVar1 = local_1b0 + 0x10;
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if (local_e0._6_1_ != '=') goto LAB_00107ce6;
    Tokenizer::getToken((Token *)local_200,this->tokenizer);
    std::__cxx11::string::operator=((string *)local_120._M_local_buf,(string *)local_200);
    std::__cxx11::string::operator=((string *)local_100._M_local_buf,(string *)&local_1e0);
    local_e0 = local_1c0;
    ppSStack_d8 = ppSStack_1b8;
    this_01 = (AssignmentStatement *)local_1b0;
    std::__cxx11::string::operator=((string *)local_d0,(string *)this_01);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    this_00._M_p = local_188._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if (local_e0._6_1_ == '[') goto LAB_00107c00;
    Tokenizer::ungetToken(this->tokenizer);
    pEVar2 = exprOrTest(this);
    this_01 = (AssignmentStatement *)operator_new(0xf0);
    ExprNode::token((Token *)local_200,(ExprNode *)this_00._M_p);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_200._0_8_,(pointer)(local_200._0_8_ + local_200._8_8_));
    AssignmentStatement::AssignmentStatement(this_01,&local_180,local_190,pEVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._0_8_ + 1);
    }
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) goto LAB_00107c00;
  }
  operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
LAB_00107c00:
  if (local_d0[0] != &local_c0) {
    operator_delete(local_d0[0],local_c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_allocated_capacity != &local_f0) {
    operator_delete((void *)local_100._M_allocated_capacity,
                    (ulong)(local_f0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_allocated_capacity != &local_110) {
    operator_delete((void *)local_120._M_allocated_capacity,
                    (ulong)(local_110._M_allocated_capacity + 1));
  }
  return this_01;
}

Assistant:

AssignmentStatement *Parser::assignStmt(ExprNode *id) {

    //assign_stmt: ID '=' test

//    Token varName = tokenizer.getToken();
//    if (!varName.isName())
//        die("Parser::assignStmt", "Expected a name token, instead got", varName);
    Token openBrace = tokenizer.getToken();
    if (!openBrace.isOpenBrace()) { // ID =
        if (!openBrace.isAssignmentOperator())
            die("Parser::assignStmt", "Expected an equal sign, instead got", openBrace);
        openBrace = tokenizer.getToken();
        if (!openBrace.isOpenBrace()) {
            tokenizer.ungetToken();
            ExprNode *rightHandSideExpr = test();
            return new AssignmentStatement(id->token().getName(), rightHandSideExpr);
        } else{
            Testlist *arrayTestlist = arrayInit();
//            Token closeBrace = tokenizer.getToken();
//            if (!closeBrace.isCloseBrace())
//                die("Parser::assignStmt", "Expected an ] sign, instead got", closeBrace);
            return new AssignmentStatement(id->token().getName(), arrayTestlist);
        }
    }else{ //  ID[...] =
        tokenizer.ungetToken();
        ExprNode *subscription = sub();
        openBrace = tokenizer.getToken();
        if (!openBrace.isAssignmentOperator())
            die("Parser::assignStmt", "Expected an equal sign, instead got", openBrace);
        openBrace = tokenizer.getToken();
        if (!openBrace.isOpenBrace()) { // test
            tokenizer.ungetToken();
            ExprNode *rightHandSideExpr = test();
            return new AssignmentStatement(id->token().getName(), subscription, rightHandSideExpr);
        }
//        } else{ // [...]
//            Testlist *arrayTestlist = arrayInit();
////            Token closeBrace = tokenizer.getToken();
////            if (!closeBrace.isCloseBrace())
////                die("Parser::assignStmt", "Expected an ] sign, instead got", closeBrace);
//            return new AssignmentStatement(id->token().getName(),subscription, arrayTestlist);
//        }
    }





}